

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::IsMine(CWallet *this,CTransaction *tx)

{
  long lVar1;
  pointer pCVar2;
  pointer pCVar3;
  isminetype iVar4;
  pointer pCVar5;
  long in_FS_OFFSET;
  bool bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar2 == pCVar3) {
    bVar6 = false;
  }
  else {
    do {
      pCVar5 = pCVar2 + 1;
      iVar4 = IsMine(this,&pCVar2->scriptPubKey);
      bVar6 = iVar4 != ISMINE_NO;
      if (bVar6) break;
      pCVar2 = pCVar5;
    } while (pCVar5 != pCVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool CWallet::IsMine(const CTransaction& tx) const
{
    AssertLockHeld(cs_wallet);
    for (const CTxOut& txout : tx.vout)
        if (IsMine(txout))
            return true;
    return false;
}